

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_positional_reference.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformPositionalReference(Transformer *this,PGPositionalReference *node)

{
  type expr;
  ParserException *this_00;
  long in_RDX;
  unsigned_long local_48;
  string local_40;
  
  if (0 < *(int *)(in_RDX + 4)) {
    local_48 = NumericCastImpl<unsigned_long,_int,_false>::Convert(*(int *)(in_RDX + 4));
    make_uniq<duckdb::PositionalReferenceExpression,unsigned_long>((duckdb *)&local_40,&local_48);
    expr = unique_ptr<duckdb::PositionalReferenceExpression,_std::default_delete<duckdb::PositionalReferenceExpression>,_true>
           ::operator*((unique_ptr<duckdb::PositionalReferenceExpression,_std::default_delete<duckdb::PositionalReferenceExpression>,_true>
                        *)&local_40);
    SetQueryLocation(&expr->super_ParsedExpression,*(int *)(in_RDX + 8));
    (this->parent).ptr = (Transformer *)local_40._M_dataplus._M_p;
    return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
           this;
  }
  this_00 = (ParserException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_40,"Positional reference node needs to be >= 1",(allocator *)&local_48
            );
  ParserException::ParserException(this_00,&local_40);
  __cxa_throw(this_00,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformPositionalReference(duckdb_libpgquery::PGPositionalReference &node) {
	if (node.position <= 0) {
		throw ParserException("Positional reference node needs to be >= 1");
	}
	auto result = make_uniq<PositionalReferenceExpression>(NumericCast<idx_t>(node.position));
	SetQueryLocation(*result, node.location);
	return std::move(result);
}